

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O3

void __thiscall Rml::DecoratorText::DecoratorText(DecoratorText *this)

{
  Decorator::Decorator(&this->super_Decorator);
  (this->super_Decorator)._vptr_Decorator = (_func_int **)&PTR__DecoratorText_0032f0d8;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->inherit_color = false;
  (this->color).red = '\0';
  (this->color).green = '\0';
  (this->color).blue = '\0';
  (this->color).alpha = 0xff;
  (this->align).x.number = 0.0;
  (this->align).x.unit = UNKNOWN;
  (this->align).y.number = 0.0;
  (this->align).y.unit = UNKNOWN;
  return;
}

Assistant:

DecoratorText::DecoratorText() {}